

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

Locale * __thiscall
icu_63::Locale::forLanguageTag
          (Locale *__return_storage_ptr__,Locale *this,StringPiece tag,UErrorCode *status)

{
  int32_t sLength;
  char *localeID_00;
  UErrorCode *errorCode;
  int32_t tagLen;
  int32_t resultCapacity;
  int32_t parsedLength;
  CharString localeID;
  int32_t local_84;
  Locale *local_80;
  int local_74;
  CharString local_70;
  
  errorCode = tag._8_8_;
  tagLen = (int32_t)tag.ptr_;
  Locale(__return_storage_ptr__,(ELocaleType)this);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_80 = __return_storage_ptr__;
    MaybeStackArray<char,_40>::MaybeStackArray(&local_70.buffer);
    local_70.len = 0;
    *local_70.buffer.ptr = '\0';
    local_84 = tagLen;
    while( true ) {
      localeID_00 = CharString::getAppendBuffer(&local_70,local_84,local_84,&local_84,errorCode);
      if (U_ZERO_ERROR < *errorCode) break;
      sLength = ulocimp_forLanguageTag_63
                          ((char *)this,tagLen,localeID_00,local_84,&local_74,errorCode);
      if (*errorCode != U_BUFFER_OVERFLOW_ERROR) {
        if (U_ZERO_ERROR < *errorCode) break;
        if (local_74 == tagLen) {
          CharString::append(&local_70,localeID_00,sLength,errorCode);
          if (*errorCode == U_STRING_NOT_TERMINATED_WARNING) {
            *errorCode = U_ZERO_ERROR;
          }
          if (U_ZERO_ERROR < *errorCode) break;
          init(local_80,(EVP_PKEY_CTX *)local_70.buffer.ptr);
          if (local_80->fIsBogus == '\0') break;
        }
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        break;
      }
      *errorCode = U_ZERO_ERROR;
      local_84 = sLength;
    }
    MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
    __return_storage_ptr__ = local_80;
  }
  return __return_storage_ptr__;
}

Assistant:

Locale U_EXPORT2
Locale::forLanguageTag(StringPiece tag, UErrorCode& status)
{
    Locale result(Locale::eBOGUS);

    if (U_FAILURE(status)) {
        return result;
    }

    // If a BCP-47 language tag is passed as the language parameter to the
    // normal Locale constructor, it will actually fall back to invoking
    // uloc_forLanguageTag() to parse it if it somehow is able to detect that
    // the string actually is BCP-47. This works well for things like strings
    // using BCP-47 extensions, but it does not at all work for things like
    // BCP-47 grandfathered tags (eg. "en-GB-oed") which are possible to also
    // interpret as ICU locale IDs and because of that won't trigger the BCP-47
    // parsing. Therefore the code here explicitly calls uloc_forLanguageTag()
    // and then Locale::init(), instead of just calling the normal constructor.

    // All simple language tags will have the exact same length as ICU locale
    // ID strings as they have as BCP-47 strings (like "en_US" for "en-US").
    CharString localeID;
    int32_t resultCapacity = tag.size();

    char* buffer;
    int32_t parsedLength, reslen;

    for (;;) {
        buffer = localeID.getAppendBuffer(
                /*minCapacity=*/resultCapacity,
                /*desiredCapacityHint=*/resultCapacity,
                resultCapacity,
                status);

        if (U_FAILURE(status)) {
            return result;
        }

        reslen = ulocimp_forLanguageTag(
                tag.data(),
                tag.length(),
                buffer,
                resultCapacity,
                &parsedLength,
                &status);

        if (status != U_BUFFER_OVERFLOW_ERROR) {
            break;
        }

        // For all BCP-47 language tags that use extensions, the corresponding
        // ICU locale ID will be longer but uloc_forLanguageTag() does compute
        // the exact length needed so this memory reallocation will be done at
        // most once.
        resultCapacity = reslen;
        status = U_ZERO_ERROR;
    }

    if (U_FAILURE(status)) {
        return result;
    }

    if (parsedLength != tag.size()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    localeID.append(buffer, reslen, status);
    if (status == U_STRING_NOT_TERMINATED_WARNING) {
        status = U_ZERO_ERROR;  // Terminators provided by CharString.
    }

    if (U_FAILURE(status)) {
        return result;
    }

    result.init(localeID.data(), /*canonicalize=*/FALSE);
    if (result.isBogus()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return result;
}